

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O1

void delDirOrFile(int id,int parentid)

{
  int iVar1;
  inode *piVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)parentid;
  if (inodes[id].i_mode == 2) {
    iVar1 = inodes[id].i_file_size;
    inodes[parentid].i_file_size = inodes[parentid].i_file_size - iVar1;
    if (parentid != 0) {
      do {
        uVar5 = (ulong)*(int *)(emptyspaces + (long)inodes[(int)uVar5].i_blocks[0] * 0x1000 + 0x1fc)
        ;
        inodes[uVar5].i_file_size = inodes[uVar5].i_file_size - iVar1;
      } while (uVar5 != 0);
    }
    lVar3 = (long)inodes[id].i_blocks[0];
    lVar4 = lVar3 << 0xc;
    super_block.inode_bitmap[id] = false;
  }
  else {
    lVar4 = (long)inodes[id].i_blocks[0] * 0x1000;
    lVar3 = 0;
    do {
      if (emptyspaces[lVar3 + lVar4 + 0x200] != '\0') {
        delDirOrFile(*(int *)(emptyspaces + lVar3 + lVar4 + 0x2fc),id);
      }
      lVar3 = lVar3 + 0x100;
    } while (lVar3 != 0xe00);
    super_block.inode_bitmap[id] = false;
    lVar3 = (long)inodes[id].i_blocks[0];
  }
  super_block.block_bitmap[lVar3] = false;
  memset(emptyspaces + lVar4,0,0x1000);
  inodes[id].i_id = 0;
  inodes[id].i_mode = 0;
  inodes[id].i_file_size = 0;
  inodes[id].i_blocks[0] = 0;
  piVar2 = inodes + id;
  piVar2->i_place_holder[0] = '\0';
  piVar2->i_place_holder[1] = '\0';
  piVar2->i_place_holder[2] = '\0';
  piVar2->i_place_holder[3] = '\0';
  piVar2->i_place_holder[4] = '\0';
  piVar2->i_place_holder[5] = '\0';
  piVar2->i_place_holder[6] = '\0';
  piVar2->i_place_holder[7] = '\0';
  piVar2 = inodes + id;
  piVar2->i_place_holder[8] = '\0';
  piVar2->i_place_holder[9] = '\0';
  piVar2->i_place_holder[10] = '\0';
  piVar2->i_place_holder[0xb] = '\0';
  piVar2->i_place_holder[0xc] = '\0';
  piVar2->i_place_holder[0xd] = '\0';
  piVar2->i_place_holder[0xe] = '\0';
  piVar2->i_place_holder[0xf] = '\0';
  return;
}

Assistant:

void delDirOrFile(int id, int parentid) {
    if (inodes[id].i_mode == A_FILE) {
        int size = inodes[id].i_file_size;
        inodes[parentid].i_file_size -= size;
        while(parentid != 0){
            parentid = getParentById(parentid);
            inodes[parentid].i_file_size -= size;
        }
        File_Block *p = getAddressByLocation_File(inodes[id].i_blocks[0]);
        inode *q = &inodes[id];
        super_block.inode_bitmap[id] = 0;
        super_block.block_bitmap[inodes[id].i_blocks[0]] = 0;
        memset(p, '\0', sizeof(File_Block));
        memset(q, '\0', sizeof(inode));
    }
    else {
        dir_block *p = getAddressByLocation_Folder(inodes[id].i_blocks[0]);
        for (int i = 2; i < 16; i++) {
            if (strcmp(p->dirs[i].name, "") != 0) {
                delDirOrFile(p->dirs[i].inode_id, id);
            }
        }
        inode *q = &inodes[id];
        super_block.inode_bitmap[id] = 0;
        super_block.block_bitmap[inodes[id].i_blocks[0]] = 0;
        memset(p, '\0', sizeof(dir_block));
        memset(q, '\0', sizeof(inode));
    }
}